

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O3

ostream * OpenMD::operator<<(ostream *o,RectMatrix<double,_3U,_3U> *m)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  
  pdVar2 = m->data_[0] + 1;
  lVar4 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
    std::ostream::_M_insert<double>(m->data_[lVar4][0]);
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t",1);
      pdVar1 = pdVar2 + lVar3;
      lVar3 = lVar3 + 1;
      std::ostream::_M_insert<double>(*pdVar1);
    } while (lVar3 != 2);
    std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + (char)o);
    std::ostream::put((char)o);
    std::ostream::flush();
    lVar4 = lVar4 + 1;
    pdVar2 = pdVar2 + 3;
  } while (lVar4 != 3);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o,
                           const RectMatrix<Real, Row, Col>& m) {
    for (unsigned int i = 0; i < Row; i++) {
      o << "(";
      for (unsigned int j = 0; j < Col; j++) {
        o << m(i, j);
        if (j != Col - 1) o << "\t";
      }
      o << ")" << std::endl;
    }
    return o;
  }